

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

int prune_luma_odd_delta_angles_using_rd_cost
              (MB_MODE_INFO *mbmi,int64_t *intra_modes_rd_cost,int64_t best_rd,
              int prune_luma_odd_delta_angles_in_intra)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int64_t rd_thresh;
  int luma_delta_angle;
  bool local_31;
  
  uVar1 = (uint)*(char *)(in_RDI + 0x58);
  if ((in_ECX != 0) &&
     (iVar2 = av1_is_directional_mode(*(PREDICTION_MODE *)(in_RDI + 2)), iVar2 != 0)) {
    uVar3 = uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = -uVar1;
    }
    if (((uVar3 & 1) != 0) && (in_RDX != 0x7fffffffffffffff)) {
      lVar4 = in_RDX + (in_RDX >> 3);
      local_31 = false;
      if (lVar4 < *(long *)(in_RSI + (long)(int)(uVar1 + 3) * 8)) {
        local_31 = lVar4 < *(long *)(in_RSI + (long)(int)(uVar1 + 5) * 8);
      }
      return (uint)local_31;
    }
  }
  return 0;
}

Assistant:

static inline int prune_luma_odd_delta_angles_using_rd_cost(
    const MB_MODE_INFO *const mbmi, const int64_t *const intra_modes_rd_cost,
    int64_t best_rd, int prune_luma_odd_delta_angles_in_intra) {
  const int luma_delta_angle = mbmi->angle_delta[PLANE_TYPE_Y];
  if (!prune_luma_odd_delta_angles_in_intra ||
      !av1_is_directional_mode(mbmi->mode) || !(abs(luma_delta_angle) & 1) ||
      best_rd == INT64_MAX)
    return 0;

  const int64_t rd_thresh = best_rd + (best_rd >> 3);

  // Neighbour rdcosts are considered for pruning of odd delta angles as
  // mentioned below:
  // Delta angle      Delta angle rdcost
  // to be pruned     to be considered
  //    -3                   -2
  //    -1                -2, 0
  //     1                 0, 2
  //     3                    2
  return intra_modes_rd_cost[luma_delta_angle + MAX_ANGLE_DELTA] > rd_thresh &&
         intra_modes_rd_cost[luma_delta_angle + MAX_ANGLE_DELTA + 2] >
             rd_thresh;
}